

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Error FT_List_Iterate(FT_List list,FT_List_Iterator iterator,void *user)

{
  FT_ListNode pFVar1;
  FT_ListNode next;
  FT_ListNode pFStack_30;
  FT_Error error;
  FT_ListNode cur;
  void *user_local;
  FT_List_Iterator iterator_local;
  FT_List list_local;
  
  next._4_4_ = 0;
  if ((list == (FT_List)0x0) || (iterator == (FT_List_Iterator)0x0)) {
    list_local._4_4_ = 6;
  }
  else {
    pFStack_30 = list->head;
    do {
      if (pFStack_30 == (FT_ListNode)0x0) break;
      pFVar1 = pFStack_30->next;
      next._4_4_ = (*iterator)(pFStack_30,user);
      pFStack_30 = pFVar1;
    } while (next._4_4_ == 0);
    list_local._4_4_ = next._4_4_;
  }
  return list_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_List_Iterate( FT_List           list,
                   FT_List_Iterator  iterator,
                   void*             user )
  {
    FT_ListNode  cur;
    FT_Error     error = FT_Err_Ok;


    if ( !list || !iterator )
      return FT_THROW( Invalid_Argument );

    cur = list->head;

    while ( cur )
    {
      FT_ListNode  next = cur->next;


      error = iterator( cur, user );
      if ( error )
        break;

      cur = next;
    }

    return error;
  }